

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O1

void __thiscall btLCP::pN_plusequals_ANi(btLCP *this,btScalar *p,int i,int sign)

{
  uint uVar1;
  btScalar *pbVar2;
  ulong uVar3;
  long lVar4;
  
  lVar4 = (long)this->m_nC;
  pbVar2 = this->m_A[i];
  uVar1 = this->m_nN;
  if (sign < 1) {
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        p[lVar4 + uVar3] = p[lVar4 + uVar3] - pbVar2[lVar4 + uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  else if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      p[lVar4 + uVar3] = pbVar2[lVar4 + uVar3] + p[lVar4 + uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return;
}

Assistant:

void btLCP::pN_plusequals_ANi (btScalar *p, int i, int sign)
{
  const int nC = m_nC;
  btScalar *aptr = BTAROW(i) + nC;
  btScalar *ptgt = p + nC;
  if (sign > 0) {
    const int nN = m_nN;
    for (int j=0; j<nN; ++j) ptgt[j] += aptr[j];
  }
  else {
    const int nN = m_nN;
    for (int j=0; j<nN; ++j) ptgt[j] -= aptr[j];
  }
}